

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

void proxy_http_free(ProxyNegotiator *pn)

{
  HttpProxyNegotiator *s;
  ProxyNegotiator *pn_local;
  
  strbuf_free((strbuf *)pn[-2].output[0].binarysink_[0].writefmtv);
  strbuf_free((strbuf *)pn[-2].output[0].binarysink_[0].binarysink_);
  strbuf_free((strbuf *)pn[-2].itr);
  strbuf_free(*(strbuf **)&pn[-2].aborted);
  strbuf_free((strbuf *)pn[-1].vt);
  strbuf_free((strbuf *)pn[-1].output[0].binarysink_[0].write);
  http_auth_details_free((HttpAuthDetails *)pn[-1].input);
  if (pn[-1].output[0].binarysink_[0].binarysink_ != (BinarySink *)0x0) {
    free_prompts((prompts_t *)pn[-1].output[0].binarysink_[0].binarysink_);
  }
  safefree(pn[-2].output[0].binarysink_);
  return;
}

Assistant:

static void proxy_http_free(ProxyNegotiator *pn)
{
    HttpProxyNegotiator *s = container_of(pn, HttpProxyNegotiator, pn);
    strbuf_free(s->response);
    strbuf_free(s->header);
    strbuf_free(s->token);
    strbuf_free(s->username);
    strbuf_free(s->password);
    strbuf_free(s->uri);
    http_auth_details_free(s->next_auth);
    if (s->prompts)
        free_prompts(s->prompts);
    sfree(s);
}